

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O2

int InitGlobals(void)

{
  long lVar1;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  char (*pacVar2) [256];
  CRITICAL_SECTION *pCVar3;
  char (*__s) [256];
  CRITICAL_SECTION *pCriticalSection;
  
  seanetfilenextlinecmd = -1;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    bPauseBlueView[lVar1] = 0;
    bRestartBlueView[lVar1] = 0;
  }
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    GNSSqualityNMEADevice[lVar1] = 0;
    bPauseNMEADevice[lVar1] = 0;
    bRestartNMEADevice[lVar1] = 0;
  }
  __x = RTCMusers;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    GNSSqualityublox[lVar1] = 0;
    bPauseublox[lVar1] = 0;
    bRestartublox[lVar1] = 0;
    std::
    vector<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(&RTCMuserslist,__x);
    __x = __x + 1;
  }
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)bEnableMAVLinkDeviceIN + lVar1) = 0;
    *(undefined4 *)((long)bDisplayStatusTextMAVLinkDevice + lVar1) = 0;
    *(undefined4 *)((long)custom_modeMAVLinkDevice + lVar1) = 0xffffffff;
    *(undefined4 *)((long)iArmMAVLinkDevice + lVar1) = 0xffffffff;
    *(undefined4 *)((long)setattitudetargetperiodMAVLinkDevice + lVar1) = 0xffffffff;
    *(undefined4 *)((long)setattitudetargettypeMAVLinkDevice + lVar1) = 0xffffffff;
    *(undefined8 *)((long)setattitudetargetrollMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)setattitudetargetpitchMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)setattitudetargetyawMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)setattitudetargetroll_rateMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)setattitudetargetpitch_rateMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)setattitudetargetyaw_rateMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)setattitudetargetthrustMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined4 *)((long)bTakeoffMAVLinkDevice + lVar1) = 0;
    *(undefined8 *)((long)takeoff_altitudeMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined4 *)((long)bLandMAVLinkDevice + lVar1) = 0;
    *(undefined8 *)((long)land_yawMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)land_latitudeMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)land_longitudeMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)land_altitudeMAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u1_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u2_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u3_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u4_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u5_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u6_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u7_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined8 *)((long)u8_servo_out_MAVLinkDevice + lVar1 * 2) = 0;
    *(undefined4 *)((long)GNSSqualityMAVLinkDevice + lVar1) = 0;
    *(undefined4 *)((long)bPauseMAVLinkDevice + lVar1) = 0;
    *(undefined4 *)((long)bRestartMAVLinkDevice + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    ShowGetPositionMaestroPololu[lVar1] = -1;
    SetPositionMaestroPololu[lVar1] = -1;
    bPausePololu[lVar1] = 0;
    bRestartPololu[lVar1] = 0;
  }
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    bPauseRoboteq[lVar1] = 0;
    bRestartRoboteq[lVar1] = 0;
  }
  pacVar2 = endvideorecordfilenames;
  __s = videorecordfilenames;
  pCriticalSection = VideoRecordRequestsCS;
  pCVar3 = imgsCS;
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 4) {
    InitCriticalSection(pCVar3);
    *(undefined8 *)((long)xVideo + lVar1 * 2) = 0;
    *(undefined8 *)((long)yVideo + lVar1 * 2) = 0;
    *(undefined8 *)((long)zVideo + lVar1 * 2) = 0;
    *(undefined8 *)((long)phiVideo + lVar1 * 2) = 0;
    *(undefined8 *)((long)thetaVideo + lVar1 * 2) = 0;
    *(undefined8 *)((long)psiVideo + lVar1 * 2) = 0;
    *(undefined8 *)((long)HorizontalBeamVideo + lVar1 * 2) = 0x4051800000000000;
    *(undefined4 *)((long)bPauseVideo + lVar1) = 0;
    *(undefined8 *)((long)VerticalBeamVideo + lVar1 * 2) = 0x4049000000000000;
    *(undefined4 *)((long)bRestartVideo + lVar1) = 0;
    InitCriticalSection(pCriticalSection);
    *(undefined4 *)((long)VideoRecordRequests + lVar1) = 0;
    *(undefined4 *)((long)bVideoRecordRestart + lVar1) = 0;
    memset(__s,0,0x100);
    *(undefined8 *)((long)endvideorecordfiles + lVar1 * 2) = 0;
    memset(pacVar2,0,0x100);
    *(int *)((long)videorecordwidth + lVar1) = videoimgwidth;
    *(int *)((long)videorecordheight + lVar1) = videoimgheight;
    pacVar2 = pacVar2 + 1;
    __s = __s + 1;
    pCriticalSection = pCriticalSection + 1;
    pCVar3 = pCVar3 + 1;
  }
  pCVar3 = dispimgsCS;
  for (lVar1 = 0; lVar1 < nbopencvgui; lVar1 = lVar1 + 1) {
    InitCriticalSection(pCVar3);
    pCVar3 = pCVar3 + 1;
  }
  InitCriticalSection(&SonarAltitudeEstimationCS);
  pacVar2 = ExternalProgramTriggerFileName;
  pCVar3 = ExternalProgramTriggerCS;
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)bExternalProgramTrigger + lVar1) = 0;
    InitCriticalSection(pCVar3);
    memset(pacVar2,0,0x100);
    *(undefined4 *)((long)nbretries_externalprogramtrigger + lVar1) = 0xffffffff;
    *(undefined4 *)((long)procid_externalprogramtrigger + lVar1) = 0xffffffff;
    *(undefined4 *)((long)period_externalprogramtrigger + lVar1) = 100;
    *(undefined4 *)((long)bExternalProgramTriggerDetected + lVar1) = 0;
    *(undefined4 *)((long)retrydelay_externalprogramtrigger + lVar1) = 100;
    pacVar2 = pacVar2 + 1;
    pCVar3 = pCVar3 + 1;
  }
  InitCriticalSection(&FollowMeCS);
  InitCriticalSection(&MDMCS);
  InitCriticalSection(&SeanetOverlayImgCS);
  InitCriticalSection(&SeanetConnectingCS);
  InitCriticalSection(&SeanetDataCS);
  InitCriticalSection(&StateVariablesCS);
  InitCriticalSection(&MissionFilesCS);
  InitCriticalSection(&OpenCVGUICS);
  InitCriticalSection(&OpenCVVideoCS);
  InitCriticalSection(&OpenCVVideoRecordCS);
  InitCriticalSection(&idsCS);
  InitCriticalSection(&RegistersCS);
  InitCriticalSection(&strtimeCS);
  opencvguikey = -1;
  opencvguikeytargetid = -1;
  StartChrono(&chrono_mission);
  StopChronoQuick(&chrono_mission);
  memset(szAction,0,0x100);
  memset(labels,0,0x1000);
  memset(procdefineaddrs,0,0x400);
  memset(procreturnaddrs,0,0x400);
  memset(procstackids,0,0x400);
  memset(registers,0,0x100);
  nbwpstmp = 0;
  bDeleteRoute = 1;
  memset(wpstmplat,0,0x2000);
  memset(wpstmplong,0,0x2000);
  memset(wpstmpalt,0,0x2000);
  nbWPs = 0;
  CurWP = 0;
  bWaypointsChanged = 1;
  memset(wpslat,0,0x2000);
  memset(wpslong,0,0x2000);
  memset(wpsalt,0,0x2000);
  ruddermidangle = 0.0;
  rudderminangle = -0.7;
  ruddermaxangle = 0.7;
  HeadingAndLateralControlMode = 2;
  if (((robid != 0x1000000) && (robid != 0x2000000)) && (robid != 0x4000000)) {
    HeadingAndLateralControlMode = 0;
  }
  return 0;
}

Assistant:

inline int InitGlobals(void)
{
	int i = 0;

	// Missing error checking...

	seanetfilenextlinecmd = -1;

	for (i = 0; i < MAX_NB_BLUEVIEW; i++)
	{
		bPauseBlueView[i] = FALSE;
		bRestartBlueView[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_NMEADEVICE; i++)
	{
		GNSSqualityNMEADevice[i] = 0;
		bPauseNMEADevice[i] = FALSE;
		bRestartNMEADevice[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_UBLOX; i++)
	{
		GNSSqualityublox[i] = 0;
		bPauseublox[i] = FALSE;
		bRestartublox[i] = FALSE;
		RTCMuserslist.push_back(RTCMusers[i]);
	}

	for (i = 0; i < MAX_NB_MAVLINKDEVICE; i++)
	{
		bEnableMAVLinkDeviceIN[i] = FALSE;
		bDisplayStatusTextMAVLinkDevice[i] = FALSE;
		custom_modeMAVLinkDevice[i] = -1;
		iArmMAVLinkDevice[i] = -1;
		setattitudetargetperiodMAVLinkDevice[i] = -1;
		setattitudetargettypeMAVLinkDevice[i] = -1;
		setattitudetargetrollMAVLinkDevice[i] = 0;
		setattitudetargetpitchMAVLinkDevice[i] = 0;
		setattitudetargetyawMAVLinkDevice[i] = 0;
		setattitudetargetroll_rateMAVLinkDevice[i] = 0;
		setattitudetargetpitch_rateMAVLinkDevice[i] = 0;
		setattitudetargetyaw_rateMAVLinkDevice[i] = 0;
		setattitudetargetthrustMAVLinkDevice[i] = 0;
		bTakeoffMAVLinkDevice[i] = FALSE;
		takeoff_altitudeMAVLinkDevice[i] = 0;
		bLandMAVLinkDevice[i] = FALSE;
		land_yawMAVLinkDevice[i] = 0;
		land_latitudeMAVLinkDevice[i] = 0;
		land_longitudeMAVLinkDevice[i] = 0;
		land_altitudeMAVLinkDevice[i] = 0;
		u1_servo_out_MAVLinkDevice[i] = 0;
		u2_servo_out_MAVLinkDevice[i] = 0;
		u3_servo_out_MAVLinkDevice[i] = 0;
		u4_servo_out_MAVLinkDevice[i] = 0;
		u5_servo_out_MAVLinkDevice[i] = 0;
		u6_servo_out_MAVLinkDevice[i] = 0;
		u7_servo_out_MAVLinkDevice[i] = 0;
		u8_servo_out_MAVLinkDevice[i] = 0;
		GNSSqualityMAVLinkDevice[i] = 0;
		bPauseMAVLinkDevice[i] = FALSE;
		bRestartMAVLinkDevice[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_POLOLU; i++)
	{
		ShowGetPositionMaestroPololu[i] = -1;
		SetPositionMaestroPololu[i] = -1;
		bPausePololu[i] = FALSE;
		bRestartPololu[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_ROBOTEQ; i++)
	{
		bPauseRoboteq[i] = FALSE;
		bRestartRoboteq[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_VIDEO; i++)
	{
		InitCriticalSection(&imgsCS[i]);
#ifndef DISABLE_OPENCV_SUPPORT
		imgs[i] = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(imgs[i], CV_RGB(0, 0, 0), NULL);
#else
		imgmats[i] = cv::cvarrToMat(imgs[i]);
		imgmats[i] = cv::Mat::zeros(imgmats[i].size(), imgmats[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
		if (bUseRawImgPtrVideo) imgsbak[i] = imgs[i]; // To be able to release memory later if imgs is overwritten...
#endif // !DISABLE_OPENCV_SUPPORT
		HorizontalBeamVideo[i] = 70;
		VerticalBeamVideo[i] = 50;
		xVideo[i] = 0; yVideo[i] = 0; zVideo[i] = 0; phiVideo[i] = 0; thetaVideo[i] = 0; psiVideo[i] = 0;
		bPauseVideo[i] = FALSE;
		bRestartVideo[i] = FALSE;
		InitCriticalSection(&VideoRecordRequestsCS[i]);
		VideoRecordRequests[i] = 0;
		bVideoRecordRestart[i] = FALSE;
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		videorecordfiles[i] = NULL;
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
		memset(videorecordfilenames[i], 0, sizeof(videorecordfilenames[i]));
		endvideorecordfiles[i] = NULL;
		memset(endvideorecordfilenames[i], 0, sizeof(endvideorecordfilenames[i]));
		videorecordwidth[i] = videoimgwidth;
		videorecordheight[i] = videoimgheight;
	}

	for (i = 0; i < nbopencvgui; i++)
	{
		InitCriticalSection(&dispimgsCS[i]);
#ifndef DISABLE_OPENCV_SUPPORT
		dispimgs[i] = cvCreateImage(cvSize(opencvguiimgwidth[i], opencvguiimgheight[i]), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(dispimgs[i], CV_RGB(0, 0, 0), NULL);
#else
		dispimgmats[i] = cv::cvarrToMat(dispimgs[i]);
		dispimgmats[i] = cv::Mat::zeros(dispimgmats[i].size(), dispimgmats[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
	}

	InitCriticalSection(&SonarAltitudeEstimationCS);

#ifndef DISABLE_OPENCV_SUPPORT
	InitCriticalSection(&ExternalVisualLocalizationCS);
	InitCriticalSection(&ExternalVisualLocalizationOverlayImgCS);
	ExternalVisualLocalizationOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(ExternalVisualLocalizationOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	ExternalVisualLocalizationOverlayImgMat = cv::cvarrToMat(ExternalVisualLocalizationOverlayImg);
	ExternalVisualLocalizationOverlayImgMat = cv::Mat::zeros(ExternalVisualLocalizationOverlayImgMat.size(), ExternalVisualLocalizationOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&WallCS);
	InitCriticalSection(&WallOverlayImgCS);
	WallOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(WallOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	WallOverlayImgMat = cv::cvarrToMat(WallOverlayImg);
	WallOverlayImgMat = cv::Mat::zeros(WallOverlayImgMat.size(), WallOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	for (i = 0; i < MAX_NB_BALL; i++)
	{
		bBallTrackingControl[i] = FALSE;
		InitCriticalSection(&BallCS[i]);
		InitCriticalSection(&BallOverlayImgCS[i]);
		BallOverlayImg[i] = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(BallOverlayImg[i], CV_RGB(0, 0, 0), NULL);
#else
		BallOverlayImgMat[i] = cv::cvarrToMat(BallOverlayImg[i]);
		BallOverlayImgMat[i] = cv::Mat::zeros(BallOverlayImgMat[i].size(), BallOverlayImgMat[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
		hmin_ball[i] = 0; hmax_ball[i] = 0; smin_ball[i] = 0; smax_ball[i] = 0; vlmin_ball[i] = 0; vlmax_ball[i] = 0;
		bHExclusive_ball[i] = FALSE; bSExclusive_ball[i] = FALSE; bVLExclusive_ball[i] = FALSE;
		r_selpix_ball[i] = 0, g_selpix_ball[i] = 0, b_selpix_ball[i] = 0;
		colormodel_ball[i] = 0;
		objMinRadiusRatio_ball[i] = 0; objRealRadius_ball[i] = 0; objMinDetectionRatio_ball[i] = 0; objDetectionRatioDuration_ball[i] = 0; d0_ball[i] = 0;
		kh_ball[i] = 0; kv_ball[i] = 0;
		lightMin_ball[i] = 0;
		lightPixRatio_ball[i] = 0;
		bAcoustic_ball[i] = 0;
		bDepth_ball[i] = 0;
		camdir_ball[i] = 0;
		bDisableControl_ball[i] = FALSE;
		bBrake_ball[i] = FALSE;
		objtype_ball[i] = 0;
		mindistproc_ball[i] = 0;
		procid_ball[i] = 0;
		videoid_ball[i] = 0;
		u_ball[i] = 0;
		x_ball[i] = 0; y_ball[i] = 0; z_ball[i] = 0;
		psi_ball[i] = 0;
		lat_ball[i] = 0; long_ball[i] = 0; alt_ball[i] = 0;
		heading_ball[i] = 0;
		detectratio_ball[i] = 0;
		bBallFound[i] = FALSE;
		lightStatus_ball[i] = 0;
	}

	InitCriticalSection(&SurfaceVisualObstacleCS);
	InitCriticalSection(&SurfaceVisualObstacleOverlayImgCS);
	SurfaceVisualObstacleOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(SurfaceVisualObstacleOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	SurfaceVisualObstacleOverlayImgMat = cv::cvarrToMat(SurfaceVisualObstacleOverlayImg);
	SurfaceVisualObstacleOverlayImgMat = cv::Mat::zeros(SurfaceVisualObstacleOverlayImgMat.size(), SurfaceVisualObstacleOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&ObstacleCS);
	InitCriticalSection(&ObstacleOverlayImgCS);
	ObstacleOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(ObstacleOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	ObstacleOverlayImgMat = cv::cvarrToMat(ObstacleOverlayImg);
	ObstacleOverlayImgMat = cv::Mat::zeros(ObstacleOverlayImgMat.size(), ObstacleOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&PingerCS);
	InitCriticalSection(&PingerOverlayImgCS);
	PingerOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(PingerOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	PingerOverlayImgMat = cv::cvarrToMat(PingerOverlayImg);
	PingerOverlayImgMat = cv::Mat::zeros(PingerOverlayImgMat.size(), PingerOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT

	for (i = 0; i < MAX_NB_EXTERNALPROGRAMTRIGGER; i++)
	{
		bExternalProgramTrigger[i] = FALSE;
		InitCriticalSection(&ExternalProgramTriggerCS[i]);
		memset(ExternalProgramTriggerFileName[i], 0, MAX_BUF_LEN);
		period_externalprogramtrigger[i] = 100;
		retrydelay_externalprogramtrigger[i] = 100;
		nbretries_externalprogramtrigger[i] = -1;
		procid_externalprogramtrigger[i] = -1;
		bExternalProgramTriggerDetected[i] = FALSE;
	}

	InitCriticalSection(&FollowMeCS);

	InitCriticalSection(&MDMCS);

	InitCriticalSection(&SeanetOverlayImgCS);
	InitCriticalSection(&SeanetConnectingCS);
	InitCriticalSection(&SeanetDataCS);
#ifndef DISABLE_OPENCV_SUPPORT
	SeanetOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(SeanetOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	SeanetOverlayImgMat = cv::cvarrToMat(SeanetOverlayImg);
	SeanetOverlayImgMat = cv::Mat::zeros(SeanetOverlayImgMat.size(), SeanetOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
	colorsonarlidar = CV_RGB(255, 255, 0);
	fSeanetOverlayImg = SONAR_IMG_LEVER_ARMS|SONAR_IMG_ALL_DISTANCES|SONAR_IMG_NORMAL;
#endif // !DISABLE_OPENCV_SUPPORT

	InitCriticalSection(&StateVariablesCS);

	InitCriticalSection(&MissionFilesCS);

	InitCriticalSection(&OpenCVGUICS);
	InitCriticalSection(&OpenCVVideoCS);
	InitCriticalSection(&OpenCVVideoRecordCS);

	InitCriticalSection(&idsCS);

	InitCriticalSection(&RegistersCS);

	InitCriticalSection(&strtimeCS);

	opencvguikey = -1;
	opencvguikeytargetid = -1;

	StartChrono(&chrono_mission);
	StopChronoQuick(&chrono_mission);
	memset(szAction, 0, sizeof(szAction));
	memset(labels, 0, sizeof(labels));
	memset(procdefineaddrs, 0, sizeof(procdefineaddrs));
	memset(procreturnaddrs, 0, sizeof(procreturnaddrs));
	memset(procstackids, 0, sizeof(procstackids));

	memset(registers, 0, sizeof(registers));
	
	bDeleteRoute = TRUE;
	nbwpstmp = 0;
	memset(wpstmplat, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmplong, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmpalt, 0, MAX_NB_WP*sizeof(double));
	bWaypointsChanged = TRUE;
	nbWPs = 0;
	CurWP = 0;
	memset(wpslat, 0, MAX_NB_WP*sizeof(double));
	memset(wpslong, 0, MAX_NB_WP*sizeof(double));
	memset(wpsalt, 0, MAX_NB_WP*sizeof(double));

	rudderminangle = -0.7;
	ruddermidangle = 0.0;
	ruddermaxangle = 0.7;

	switch (robid)
	{
	case QUADRO_SIMULATOR_ROBID:
	case COPTER_ROBID:
	case ARDUCOPTER_ROBID:
		HeadingAndLateralControlMode = HEADING_AND_LATERAL_CONTROL_MODE;
		break;
	default:
		HeadingAndLateralControlMode = PURE_HEADING_CONTROL_MODE;
		break;
	}

	return EXIT_SUCCESS;
}